

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int sendto_buffer_target(buffer_target *target,char *msg,size_t msg_length)

{
  ulong __n;
  ulong __n_00;
  ulong local_40;
  size_t free_space_left;
  size_t buffer_remaining;
  size_t write_start;
  size_t msg_length_local;
  char *msg_local;
  buffer_target *target_local;
  
  __n = msg_length - 1;
  if (__n < target->size) {
    pthread_lock_mutex(&target->buffer_mutex);
    local_40 = target->write_position;
    __n_00 = target->size - local_40;
    if (__n < __n_00) {
      memcpy(target->buffer + local_40,msg,__n);
      target->write_position = msg_length + target->write_position;
    }
    else {
      memcpy(target->buffer + local_40,msg,__n_00);
      memcpy(target->buffer,msg + __n_00,__n - __n_00);
      target->write_position = (__n - __n_00) + 1;
    }
    target->buffer[target->write_position - 1] = '\0';
    if (local_40 < target->read_position) {
      local_40 = target->read_position - local_40;
    }
    else {
      local_40 = (target->size - local_40) + target->read_position;
    }
    if ((local_40 <= __n) &&
       (target->read_position = (target->write_position + 1) % target->size,
       target->buffer[target->read_position] == '\0')) {
      target->read_position = (target->read_position + 1) % target->size;
    }
    pthread_unlock_mutex(&target->buffer_mutex);
    target_local._4_4_ = cap_size_t_to_int(msg_length);
  }
  else {
    raise_argument_too_big
              ("buffer is too small for the given message",__n,
               "the size of the message that was attempted to be sent");
    target_local._4_4_ = -1;
  }
  return target_local._4_4_;
}

Assistant:

int
sendto_buffer_target( struct buffer_target *target,
                      const char *msg,
                      size_t msg_length ) {
  size_t write_start;
  size_t buffer_remaining;
  size_t free_space_left;

  // leave off the newline
  msg_length--;

  if( msg_length >= target->size ) {
    raise_argument_too_big( L10N_BUFFER_TOO_SMALL_ERROR_MESSAGE,
                            msg_length,
                            L10N_MESSAGE_SIZE_ERROR_CODE_TYPE );
    return -1;
  }

  config_lock_mutex( &target->buffer_mutex );
  write_start = target->write_position;
  buffer_remaining = target->size - write_start;

  if( buffer_remaining > msg_length ) {
    // the entire message will fit into the buffer without wrapping around
    memcpy( target->buffer + write_start, msg, msg_length );
    target->write_position += msg_length + 1;

  } else {
    // we need to split the message and wrap it around to the beginning
    memcpy( target->buffer + write_start, msg, buffer_remaining );
    memcpy( target->buffer,
            msg + buffer_remaining,
            msg_length - buffer_remaining );
    target->write_position = msg_length - buffer_remaining + 1;
  }

  target->buffer[target->write_position - 1] = '\0';

  // checking to see if we have overwritten older messages and need to adjust
  // the read position to reflect this
  if( target->read_position > write_start ) {
    free_space_left = target->read_position - write_start;
  } else {
    free_space_left = ( target->size - write_start ) + target->read_position;
  }

  if( free_space_left <= msg_length ) {
    target->read_position = ( target->write_position + 1 ) % target->size;

    if( target->buffer[target->read_position] == '\0' ) {
      target->read_position = ( target->read_position + 1 ) % target->size;
    }
  }

  config_unlock_mutex( &target->buffer_mutex );

  return cap_size_t_to_int( msg_length + 1 );
}